

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse2_128_32.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_table_striped_profile_sse2_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ulong uVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  ulong uVar7;
  uint uVar8;
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [16];
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  parasail_result_t *ppVar16;
  __m128i *palVar17;
  __m128i *ptr;
  __m128i *ptr_00;
  int32_t *ptr_01;
  long lVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  __m128i *palVar23;
  long lVar24;
  __m128i *palVar25;
  long lVar26;
  uint uVar27;
  ulong size;
  ulong uVar28;
  int iVar29;
  int32_t iVar30;
  uint uVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  int iVar35;
  uint uVar36;
  int iVar37;
  int iVar47;
  undefined1 auVar38 [16];
  int iVar48;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  __m128i_32_t A;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  __m128i alVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  __m128i alVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  int iVar68;
  int iVar69;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  int iVar70;
  int iVar78;
  int iVar79;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  int iVar80;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  int iVar81;
  int iVar83;
  int iVar84;
  int iVar85;
  undefined1 auVar82 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  uint local_d8;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_table_striped_profile_sse2_128_32_cold_8();
  }
  else {
    pvVar5 = (profile->profile32).score;
    if (pvVar5 == (void *)0x0) {
      parasail_sg_flags_table_striped_profile_sse2_128_32_cold_7();
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_table_striped_profile_sse2_128_32_cold_6();
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          parasail_sg_flags_table_striped_profile_sse2_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_table_striped_profile_sse2_128_32_cold_4();
        }
        else {
          uVar33 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sg_flags_table_striped_profile_sse2_128_32_cold_3();
          }
          else if (open < 0) {
            parasail_sg_flags_table_striped_profile_sse2_128_32_cold_2();
          }
          else if (gap < 0) {
            parasail_sg_flags_table_striped_profile_sse2_128_32_cold_1();
          }
          else {
            uVar36 = uVar3 - 1;
            uVar1 = (ulong)uVar3 + 3;
            size = uVar1 >> 2;
            uVar7 = (ulong)uVar36 % size;
            iVar29 = -open;
            iVar14 = ppVar6->min;
            uVar21 = 0x80000000 - iVar14;
            if (iVar14 != iVar29 && SBORROW4(iVar14,iVar29) == iVar14 + open < 0) {
              uVar21 = open | 0x80000000;
            }
            iVar14 = 0x7ffffffe - ppVar6->max;
            ppVar16 = parasail_result_new_table1((uint)uVar1 & 0x7ffffffc,s2Len);
            if (ppVar16 != (parasail_result_t *)0x0) {
              iVar35 = (int)(uVar36 / size);
              iVar19 = (uint)(s1_end != 0) * 0x10;
              ppVar16->flag =
                   iVar19 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                   (uint)(s2_end != 0) << 0xf | ppVar16->flag | 0x4420802;
              palVar17 = parasail_memalign___m128i(0x10,size);
              ptr = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign___m128i(0x10,size);
              ptr_01 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1U));
              auVar11 = _DAT_009049d0;
              auVar43 = _DAT_00904920;
              auVar38._0_4_ = -(uint)((int)((ulong)palVar17 >> 0x20) == 0 && (int)palVar17 == 0);
              auVar38._4_4_ = -(uint)((int)ptr == 0 && (int)((ulong)ptr >> 0x20) == 0);
              auVar38._8_4_ = -(uint)((int)((ulong)ptr_00 >> 0x20) == 0 && (int)ptr_00 == 0);
              auVar38._12_4_ = -(uint)((int)ptr_01 == 0 && (int)((ulong)ptr_01 >> 0x20) == 0);
              iVar19 = movmskps(iVar19,auVar38);
              if (iVar19 == 0) {
                uVar20 = s2Len - 1;
                iVar19 = -iVar35 + 3;
                uVar21 = uVar21 + 1;
                uVar28 = 0;
                auVar77._4_4_ = gap;
                auVar77._0_4_ = gap;
                auVar77._8_4_ = gap;
                auVar77._12_4_ = gap;
                palVar23 = palVar17;
                palVar25 = ptr_00;
                do {
                  if (s1_beg == 0) {
                    auVar49._8_4_ = (int)uVar28;
                    auVar49._0_8_ = uVar28;
                    auVar49._12_4_ = (int)(uVar28 >> 0x20);
                    alVar57[0]._0_4_ = iVar29 - (int)((uVar28 & 0xffffffff) * (ulong)(uint)gap);
                    alVar57[0]._4_4_ =
                         iVar29 - (int)((auVar49._8_8_ + size & 0xffffffff) * (ulong)(uint)gap);
                    alVar57[1]._0_4_ =
                         iVar29 - (int)((size * 2 + uVar28 & 0xffffffff) * (ulong)(uint)gap);
                    alVar57[1]._4_4_ =
                         iVar29 - (int)((size * 3 + auVar49._8_8_ & 0xffffffff) * (ulong)(uint)gap);
                  }
                  else {
                    alVar57[0] = 0;
                    alVar57[1] = 0;
                  }
                  auVar88._0_8_ = alVar57[0];
                  auVar88._8_4_ = alVar57[0]._4_4_;
                  auVar88._12_4_ = -(uint)(alVar57[0]._4_4_ < 0);
                  auVar91._0_8_ = alVar57[1];
                  auVar91._8_4_ = alVar57[1]._4_4_;
                  auVar91._12_4_ = -(uint)(alVar57[1]._4_4_ < 0);
                  auVar92._0_8_ =
                       CONCAT44(-(uint)((int)alVar57[1] < 0),(int)alVar57[1]) - (ulong)(uint)open;
                  auVar92._8_8_ = auVar91._8_8_ - (ulong)(uint)open;
                  auVar89._0_8_ =
                       CONCAT44(-(uint)((int)alVar57[0] < 0),(int)alVar57[0]) - (ulong)(uint)open;
                  auVar89._8_8_ = auVar88._8_8_ - (ulong)(uint)open;
                  auVar38 = auVar89 ^ auVar43;
                  iVar47 = auVar38._4_4_;
                  iVar48 = auVar38._12_4_;
                  auVar51._0_4_ = -(uint)(iVar47 == -1);
                  auVar51._4_4_ = -(uint)(iVar47 == -1);
                  auVar51._8_4_ = -(uint)(iVar48 == -1);
                  auVar51._12_4_ = -(uint)(iVar48 == -1);
                  iVar37 = -(uint)(0 < auVar38._0_4_);
                  auVar39._4_4_ = -(uint)(-1 < iVar47);
                  iVar47 = -(uint)(0 < auVar38._8_4_);
                  auVar39._12_4_ = -(uint)(-1 < iVar48);
                  auVar55._4_4_ = iVar37;
                  auVar55._0_4_ = iVar37;
                  auVar55._8_4_ = iVar47;
                  auVar55._12_4_ = iVar47;
                  auVar39._0_4_ = auVar39._4_4_;
                  auVar39._8_4_ = auVar39._12_4_;
                  auVar39 = auVar39 | auVar55 & auVar51;
                  auVar38 = ~auVar39 & auVar11 | auVar89 & auVar39;
                  auVar49 = auVar92 ^ auVar43;
                  iVar47 = auVar49._4_4_;
                  iVar48 = auVar49._12_4_;
                  auVar56._0_4_ = -(uint)(iVar47 == -1);
                  auVar56._4_4_ = -(uint)(iVar47 == -1);
                  auVar56._8_4_ = -(uint)(iVar48 == -1);
                  auVar56._12_4_ = -(uint)(iVar48 == -1);
                  iVar37 = -(uint)(0 < auVar49._0_4_);
                  auVar50._4_4_ = -(uint)(-1 < iVar47);
                  iVar47 = -(uint)(0 < auVar49._8_4_);
                  auVar50._12_4_ = -(uint)(-1 < iVar48);
                  auVar90._4_4_ = iVar37;
                  auVar90._0_4_ = iVar37;
                  auVar90._8_4_ = iVar47;
                  auVar90._12_4_ = iVar47;
                  auVar50._0_4_ = auVar50._4_4_;
                  auVar50._8_4_ = auVar50._12_4_;
                  auVar50 = auVar50 | auVar90 & auVar56;
                  auVar49 = ~auVar50 & auVar11 | auVar92 & auVar50;
                  *palVar23 = alVar57;
                  *(int *)*palVar25 = auVar38._0_4_;
                  *(int *)((long)*palVar25 + 4) = auVar38._8_4_;
                  *(int *)(*palVar25 + 1) = auVar49._0_4_;
                  *(int *)((long)*palVar25 + 0xc) = auVar49._8_4_;
                  uVar28 = uVar28 + 1;
                  palVar25 = palVar25 + 1;
                  palVar23 = palVar23 + 1;
                } while (size != uVar28);
                *ptr_01 = 0;
                auVar49 = _DAT_00903aa0;
                auVar38 = _DAT_00903a90;
                lVar24 = uVar33 - 1;
                auVar58._8_4_ = (int)lVar24;
                auVar58._0_8_ = lVar24;
                auVar58._12_4_ = (int)((ulong)lVar24 >> 0x20);
                uVar28 = 0;
                auVar11._4_4_ = uVar21;
                auVar11._0_4_ = uVar21;
                auVar11._8_4_ = uVar21;
                auVar11._12_4_ = uVar21;
                auVar43._4_4_ = iVar14;
                auVar43._0_4_ = iVar14;
                auVar43._8_4_ = iVar14;
                auVar43._12_4_ = iVar14;
                iVar37 = iVar29;
                do {
                  auVar40._8_4_ = (int)uVar28;
                  auVar40._0_8_ = uVar28;
                  auVar40._12_4_ = (int)(uVar28 >> 0x20);
                  auVar51 = auVar58 ^ auVar49;
                  auVar39 = (auVar40 | auVar38) ^ auVar49;
                  if ((bool)(~(auVar39._4_4_ == auVar51._4_4_ && auVar51._0_4_ < auVar39._0_4_ ||
                              auVar51._4_4_ < auVar39._4_4_) & 1)) {
                    iVar30 = 0;
                    if (s2_beg == 0) {
                      iVar30 = iVar37;
                    }
                    ptr_01[uVar28 + 1] = iVar30;
                  }
                  if ((auVar39._12_4_ != auVar51._12_4_ || auVar39._8_4_ <= auVar51._8_4_) &&
                      auVar39._12_4_ <= auVar51._12_4_) {
                    iVar47 = iVar37 - gap;
                    if (s2_beg != 0) {
                      iVar47 = 0;
                    }
                    ptr_01[uVar28 + 2] = iVar47;
                  }
                  uVar28 = uVar28 + 2;
                  iVar37 = iVar37 + gap * -2;
                } while ((s2Len + 1U & 0xfffffffe) != uVar28);
                uVar8 = (uint)size;
                lVar34 = size * uVar33;
                lVar24 = 0;
                auVar87._0_4_ = -(uint)(iVar19 == 3);
                auVar87._4_4_ = -(uint)(iVar19 == 2);
                auVar87._8_4_ = -(uint)(iVar19 == 1);
                auVar87._12_4_ = -(uint)(-iVar35 == -3);
                uVar28 = 0;
                auVar38 = auVar11;
                auVar63 = auVar11;
                local_d8 = uVar20;
                do {
                  palVar23 = ptr;
                  ptr = palVar17;
                  iVar37 = ppVar6->mapper[(byte)s2[uVar28]];
                  palVar17 = ptr + (uVar8 - 1);
                  auVar9._4_8_ = auVar77._8_8_;
                  auVar9._0_4_ = (int)(*palVar17)[0];
                  auVar71._0_8_ = auVar9._0_8_ << 0x20;
                  auVar71._8_4_ = *(undefined4 *)((long)*palVar17 + 4);
                  auVar71._12_4_ = (int)(*palVar17)[1];
                  auVar72._4_12_ = auVar71._4_12_;
                  auVar72._0_4_ = ptr_01[uVar28];
                  lVar32 = 0;
                  lVar26 = lVar24;
                  auVar66 = auVar11;
                  do {
                    piVar2 = (int *)((long)pvVar5 + lVar32 + (long)iVar37 * size * 0x10);
                    auVar73._0_4_ = auVar72._0_4_ + *piVar2;
                    auVar73._4_4_ = auVar72._4_4_ + piVar2[1];
                    auVar73._8_4_ = auVar72._8_4_ + piVar2[2];
                    auVar73._12_4_ = auVar72._12_4_ + piVar2[3];
                    auVar77 = *(undefined1 (*) [16])((long)*ptr_00 + lVar32);
                    iVar81 = auVar77._0_4_;
                    auVar41._0_4_ = -(uint)(iVar81 < auVar73._0_4_);
                    iVar83 = auVar77._4_4_;
                    auVar41._4_4_ = -(uint)(iVar83 < auVar73._4_4_);
                    iVar84 = auVar77._8_4_;
                    auVar41._8_4_ = -(uint)(iVar84 < auVar73._8_4_);
                    iVar85 = auVar77._12_4_;
                    auVar41._12_4_ = -(uint)(iVar85 < auVar73._12_4_);
                    auVar49 = ~auVar41 & auVar77 | auVar73 & auVar41;
                    iVar47 = auVar66._0_4_;
                    auVar74._0_4_ = -(uint)(iVar47 < auVar49._0_4_);
                    iVar48 = auVar66._4_4_;
                    auVar74._4_4_ = -(uint)(iVar48 < auVar49._4_4_);
                    iVar68 = auVar66._8_4_;
                    auVar74._8_4_ = -(uint)(iVar68 < auVar49._8_4_);
                    iVar69 = auVar66._12_4_;
                    auVar74._12_4_ = -(uint)(iVar69 < auVar49._12_4_);
                    auVar49 = ~auVar74 & auVar66 | auVar49 & auVar74;
                    *(undefined1 (*) [16])((long)*palVar23 + lVar32) = auVar49;
                    iVar70 = auVar49._0_4_;
                    auVar59._0_4_ = -(uint)(iVar70 < auVar38._0_4_);
                    iVar78 = auVar49._4_4_;
                    auVar59._4_4_ = -(uint)(iVar78 < auVar38._4_4_);
                    iVar79 = auVar49._8_4_;
                    auVar59._8_4_ = -(uint)(iVar79 < auVar38._8_4_);
                    iVar80 = auVar49._12_4_;
                    auVar59._12_4_ = -(uint)(iVar80 < auVar38._12_4_);
                    auVar38 = ~auVar59 & auVar49 | auVar38 & auVar59;
                    auVar42._0_4_ = -(uint)(iVar70 < auVar43._0_4_);
                    auVar42._4_4_ = -(uint)(iVar78 < auVar43._4_4_);
                    auVar42._8_4_ = -(uint)(iVar79 < auVar43._8_4_);
                    auVar42._12_4_ = -(uint)(iVar80 < auVar43._12_4_);
                    auVar43 = ~auVar42 & auVar43 | auVar49 & auVar42;
                    auVar52._0_4_ = -(uint)(iVar81 < auVar43._0_4_);
                    auVar52._4_4_ = -(uint)(iVar83 < auVar43._4_4_);
                    auVar52._8_4_ = -(uint)(iVar84 < auVar43._8_4_);
                    auVar52._12_4_ = -(uint)(iVar85 < auVar43._12_4_);
                    auVar43 = ~auVar52 & auVar43 | auVar77 & auVar52;
                    auVar62._0_4_ = -(uint)(iVar47 < auVar43._0_4_);
                    auVar62._4_4_ = -(uint)(iVar48 < auVar43._4_4_);
                    auVar62._8_4_ = -(uint)(iVar68 < auVar43._8_4_);
                    auVar62._12_4_ = -(uint)(iVar69 < auVar43._12_4_);
                    auVar43 = ~auVar62 & auVar43 | auVar66 & auVar62;
                    piVar2 = ((ppVar16->field_4).rowcols)->score_row;
                    *(int *)((long)piVar2 + lVar26) = iVar70;
                    *(int *)((long)piVar2 + lVar34 * 4 + lVar26) = iVar78;
                    *(int *)((long)piVar2 + lVar34 * 8 + lVar26) = iVar79;
                    *(int *)((long)piVar2 + lVar34 * 0xc + lVar26) = iVar80;
                    auVar75._0_4_ = iVar70 - open;
                    auVar75._4_4_ = iVar78 - open;
                    auVar75._8_4_ = iVar79 - open;
                    auVar75._12_4_ = iVar80 - open;
                    auVar82._0_4_ = iVar81 - gap;
                    auVar82._4_4_ = iVar83 - gap;
                    auVar82._8_4_ = iVar84 - gap;
                    auVar82._12_4_ = iVar85 - gap;
                    auVar44._0_4_ = -(uint)(auVar75._0_4_ < auVar82._0_4_);
                    auVar44._4_4_ = -(uint)(auVar75._4_4_ < auVar82._4_4_);
                    auVar44._8_4_ = -(uint)(auVar75._8_4_ < auVar82._8_4_);
                    auVar44._12_4_ = -(uint)(auVar75._12_4_ < auVar82._12_4_);
                    *(undefined1 (*) [16])((long)*ptr_00 + lVar32) =
                         ~auVar44 & auVar75 | auVar82 & auVar44;
                    auVar64._0_4_ = iVar47 - gap;
                    auVar64._4_4_ = iVar48 - gap;
                    auVar64._8_4_ = iVar68 - gap;
                    auVar64._12_4_ = iVar69 - gap;
                    auVar65._0_4_ = -(uint)(auVar75._0_4_ < auVar64._0_4_);
                    auVar65._4_4_ = -(uint)(auVar75._4_4_ < auVar64._4_4_);
                    auVar65._8_4_ = -(uint)(auVar75._8_4_ < auVar64._8_4_);
                    auVar65._12_4_ = -(uint)(auVar75._12_4_ < auVar64._12_4_);
                    auVar66 = ~auVar65 & auVar75 | auVar64 & auVar65;
                    auVar72 = *(undefined1 (*) [16])((long)*ptr + lVar32);
                    lVar32 = lVar32 + 0x10;
                    lVar26 = lVar26 + uVar33 * 4;
                  } while (size << 4 != lVar32);
                  iVar37 = 0;
                  do {
                    iVar47 = iVar29;
                    if (s2_beg == 0) {
                      iVar47 = ptr_01[uVar28 + 1] - open;
                    }
                    auVar10._4_8_ = auVar66._8_8_;
                    auVar10._0_4_ = auVar66._0_4_;
                    auVar67._0_8_ = auVar10._0_8_ << 0x20;
                    auVar67._8_4_ = auVar66._4_4_;
                    auVar67._12_4_ = auVar66._8_4_;
                    auVar66._4_12_ = auVar67._4_12_;
                    auVar66._0_4_ = iVar47;
                    lVar32 = 0;
                    lVar26 = lVar24;
                    do {
                      auVar77 = *(undefined1 (*) [16])((long)*palVar23 + lVar32);
                      auVar76._0_4_ = -(uint)(auVar66._0_4_ < auVar77._0_4_);
                      iVar47 = auVar66._4_4_;
                      auVar76._4_4_ = -(uint)(iVar47 < auVar77._4_4_);
                      iVar48 = auVar66._8_4_;
                      auVar76._8_4_ = -(uint)(iVar48 < auVar77._8_4_);
                      iVar68 = auVar66._12_4_;
                      auVar76._12_4_ = -(uint)(iVar68 < auVar77._12_4_);
                      auVar77 = ~auVar76 & auVar66 | auVar77 & auVar76;
                      *(undefined1 (*) [16])((long)*palVar23 + lVar32) = auVar77;
                      iVar69 = auVar77._0_4_;
                      auVar45._0_4_ = -(uint)(iVar69 < auVar43._0_4_);
                      iVar70 = auVar77._4_4_;
                      auVar45._4_4_ = -(uint)(iVar70 < auVar43._4_4_);
                      iVar78 = auVar77._8_4_;
                      auVar45._8_4_ = -(uint)(iVar78 < auVar43._8_4_);
                      iVar79 = auVar77._12_4_;
                      auVar45._12_4_ = -(uint)(iVar79 < auVar43._12_4_);
                      auVar43 = ~auVar45 & auVar43 | auVar77 & auVar45;
                      auVar60._0_4_ = -(uint)(iVar69 < auVar38._0_4_);
                      auVar60._4_4_ = -(uint)(iVar70 < auVar38._4_4_);
                      auVar60._8_4_ = -(uint)(iVar78 < auVar38._8_4_);
                      auVar60._12_4_ = -(uint)(iVar79 < auVar38._12_4_);
                      auVar38 = ~auVar60 & auVar77 | auVar38 & auVar60;
                      piVar2 = ((ppVar16->field_4).rowcols)->score_row;
                      *(int *)((long)piVar2 + lVar26) = iVar69;
                      lVar18 = (long)piVar2 + lVar26;
                      *(int *)(lVar34 * 4 + lVar18) = iVar70;
                      *(int *)(lVar34 * 8 + lVar18) = iVar78;
                      *(int *)(lVar34 * 0xc + lVar18) = iVar79;
                      auVar77._0_4_ = iVar69 - open;
                      auVar77._4_4_ = iVar70 - open;
                      auVar77._8_4_ = iVar78 - open;
                      auVar77._12_4_ = iVar79 - open;
                      auVar66._0_4_ = auVar66._0_4_ - gap;
                      auVar66._4_4_ = iVar47 - gap;
                      auVar66._8_4_ = iVar48 - gap;
                      auVar66._12_4_ = iVar68 - gap;
                      auVar46._0_4_ = -(uint)(auVar77._0_4_ < auVar66._0_4_);
                      auVar46._4_4_ = -(uint)(auVar77._4_4_ < auVar66._4_4_);
                      auVar46._8_4_ = -(uint)(auVar77._8_4_ < auVar66._8_4_);
                      auVar46._12_4_ = -(uint)(auVar77._12_4_ < auVar66._12_4_);
                      iVar47 = movmskps((int)lVar18,auVar46);
                      if (iVar47 == 0) goto LAB_005c2c73;
                      lVar32 = lVar32 + 0x10;
                      lVar26 = lVar26 + uVar33 * 4;
                    } while (size << 4 != lVar32);
                    iVar37 = iVar37 + 1;
                  } while (iVar37 != 4);
LAB_005c2c73:
                  alVar57 = palVar23[uVar7];
                  auVar53._0_4_ = -(uint)(auVar63._0_4_ < (int)alVar57[0]);
                  auVar53._4_4_ = -(uint)(auVar63._4_4_ < alVar57[0]._4_4_);
                  auVar53._8_4_ = -(uint)(auVar63._8_4_ < (int)alVar57[1]);
                  auVar53._12_4_ = -(uint)(auVar63._12_4_ < alVar57[1]._4_4_);
                  auVar63 = ~auVar53 & auVar63 | (undefined1  [16])alVar57 & auVar53;
                  iVar37 = movmskps((int)uVar7 * 0x10,auVar53 & auVar87);
                  if (iVar37 != 0) {
                    local_d8 = (uint)uVar28;
                  }
                  uVar28 = uVar28 + 1;
                  lVar24 = lVar24 + 4;
                  palVar17 = palVar23;
                  if (uVar28 == uVar33) {
                    uVar27 = uVar21;
                    if (s2_end != 0) {
                      if (iVar35 < 3) {
                        iVar29 = 0;
                        do {
                          lVar24 = auVar63._8_8_;
                          uVar33 = auVar63._0_8_;
                          auVar63._0_8_ = uVar33 << 0x20;
                          auVar63._8_8_ = lVar24 << 0x20 | uVar33 >> 0x20;
                          iVar29 = iVar29 + 1;
                        } while (iVar29 < iVar19);
                      }
                      uVar27 = auVar63._12_4_;
                    }
                    uVar15 = s1_end;
                    uVar22 = uVar36;
                    if ((s1_end != 0) && ((uVar1 & 0x7ffffffc) != 0)) {
                      lVar24 = 0;
                      do {
                        uVar15 = (uint)lVar24 >> 2;
                        uVar31 = ((uint)lVar24 & 3) * uVar8 + uVar15;
                        uVar4 = uVar27;
                        uVar12 = uVar22;
                        uVar13 = local_d8;
                        if (((int)uVar31 < (int)uVar3) &&
                           (uVar4 = *(uint *)((long)*palVar23 + lVar24 * 4), uVar15 = uVar20,
                           uVar12 = uVar31, uVar13 = uVar20, (int)uVar4 <= (int)uVar27)) {
                          if ((int)uVar22 <= (int)uVar31) {
                            uVar31 = uVar22;
                          }
                          uVar15 = local_d8 ^ uVar20 | uVar4 ^ uVar27;
                          uVar4 = uVar27;
                          uVar12 = uVar22;
                          uVar13 = local_d8;
                          if (uVar15 == 0) {
                            uVar12 = uVar31;
                          }
                        }
                        local_d8 = uVar13;
                        uVar22 = uVar12;
                        uVar27 = uVar4;
                        lVar24 = lVar24 + 1;
                      } while ((uVar8 & 0x1fffffff) << 2 != (int)lVar24);
                    }
                    if (s2_end == 0 && s1_end == 0) {
                      alVar54 = palVar23[uVar7];
                      if (iVar35 < 3) {
                        iVar29 = 0;
                        do {
                          lVar24 = alVar54[1];
                          uVar33 = alVar54[0];
                          alVar54[0] = uVar33 << 0x20;
                          alVar54[1] = lVar24 << 0x20 | uVar33 >> 0x20;
                          iVar29 = iVar29 + 1;
                        } while (iVar29 < iVar19);
                      }
                      uVar27 = alVar54[1]._4_4_;
                      uVar15 = uVar20;
                      uVar22 = uVar36;
                      local_d8 = uVar20;
                    }
                    auVar86._0_4_ = -(uint)(auVar43._0_4_ < (int)uVar21);
                    auVar86._4_4_ = -(uint)(auVar43._4_4_ < (int)uVar21);
                    auVar86._8_4_ = -(uint)(auVar43._8_4_ < (int)uVar21);
                    auVar86._12_4_ = -(uint)(auVar43._12_4_ < (int)uVar21);
                    auVar61._0_4_ = -(uint)(iVar14 < auVar38._0_4_);
                    auVar61._4_4_ = -(uint)(iVar14 < auVar38._4_4_);
                    auVar61._8_4_ = -(uint)(iVar14 < auVar38._8_4_);
                    auVar61._12_4_ = -(uint)(iVar14 < auVar38._12_4_);
                    iVar14 = movmskps(uVar15,auVar61 | auVar86);
                    if (iVar14 != 0) {
                      *(byte *)&ppVar16->flag = (byte)ppVar16->flag | 0x40;
                      uVar27 = 0;
                      local_d8 = 0;
                      uVar22 = 0;
                    }
                    ppVar16->score = uVar27;
                    ppVar16->end_query = uVar22;
                    ppVar16->end_ref = local_d8;
                    parasail_free(ptr_01);
                    parasail_free(ptr_00);
                    parasail_free(ptr);
                    parasail_free(palVar23);
                    return ppVar16;
                  }
                } while( true );
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi32(_mm_set1_epi32(position),
            _mm_set_epi32(0,1,2,3));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 4);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi32_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi32_rpl(vH, vE);
            vH = _mm_max_epi32_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi32(vH, vGapO);
            vE = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            vF = _mm_slli_si128(vF, 4);
            vF = _mm_insert_epi32_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi32(vH, vGapO);
                vF = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi32(vF, vH))) goto end;
                /*vF = _mm_max_epi32_rpl(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi32(vH, vMaxH));
            vMaxH = _mm_max_epi32_rpl(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32_rpl (vH, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 4);
        }
        score = (int32_t) _mm_extract_epi32_rpl(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int32_t *t = (int32_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            score = (int32_t) _mm_extract_epi32_rpl (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}